

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O2

void __thiscall Assimp::ColladaParser::ReadEffectParam(ColladaParser *this,EffectParam *pParam)

{
  string *psVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  undefined4 extraout_var;
  allocator local_51;
  string local_50;
  
  psVar1 = &pParam->mReference;
  do {
    while( true ) {
      while( true ) {
        while( true ) {
          iVar3 = (*this->mReader->_vptr_IIrrXMLReader[2])();
          if ((char)iVar3 == '\0') {
            return;
          }
          iVar3 = (*this->mReader->_vptr_IIrrXMLReader[3])();
          if (iVar3 == 1) break;
          iVar3 = (*this->mReader->_vptr_IIrrXMLReader[3])();
          if (iVar3 == 2) {
            return;
          }
        }
        bVar2 = IsElement(this,"surface");
        if (!bVar2) break;
        TestOpening(this,"init_from");
        GetTextContent(this);
        pParam->mType = Param_Surface;
        std::__cxx11::string::assign((char *)psVar1);
        TestClosing(this,"init_from");
        SkipElement(this,"surface");
      }
      bVar2 = IsElement(this,"sampler2D");
      if ((!bVar2) || (1 < this->mFormat - FV_1_4_n)) break;
      TestOpening(this,"source");
      GetTextContent(this);
      pParam->mType = Param_Sampler;
      std::__cxx11::string::assign((char *)psVar1);
      TestClosing(this,"source");
LAB_003edbbe:
      SkipElement(this,"sampler2D");
    }
    bVar2 = IsElement(this,"sampler2D");
    if (bVar2) {
      TestOpening(this,"instance_image");
      uVar4 = GetAttribute(this,"url");
      iVar3 = (*this->mReader->_vptr_IIrrXMLReader[6])(this->mReader,(ulong)uVar4);
      if (*(char *)CONCAT44(extraout_var,iVar3) != '#') {
        std::__cxx11::string::string
                  ((string *)&local_50,"Unsupported URL format in instance_image",&local_51);
        ThrowException(this,&local_50);
      }
      pParam->mType = Param_Sampler;
      std::__cxx11::string::assign((char *)psVar1);
      goto LAB_003edbbe;
    }
    SkipElement(this);
  } while( true );
}

Assistant:

void ColladaParser::ReadEffectParam(Collada::EffectParam& pParam)
{
    while (mReader->read())
    {
        if (mReader->getNodeType() == irr::io::EXN_ELEMENT) {
            if (IsElement("surface"))
            {
                // image ID given inside <init_from> tags
                TestOpening("init_from");
                const char* content = GetTextContent();
                pParam.mType = Param_Surface;
                pParam.mReference = content;
                TestClosing("init_from");

                // don't care for remaining stuff
                SkipElement("surface");
            }
            else if (IsElement("sampler2D") && (FV_1_4_n == mFormat || FV_1_3_n == mFormat))
            {
                // surface ID is given inside <source> tags
                TestOpening("source");
                const char* content = GetTextContent();
                pParam.mType = Param_Sampler;
                pParam.mReference = content;
                TestClosing("source");

                // don't care for remaining stuff
                SkipElement("sampler2D");
            }
            else if (IsElement("sampler2D"))
            {
                // surface ID is given inside <instance_image> tags
                TestOpening("instance_image");
                int attrURL = GetAttribute("url");
                const char* url = mReader->getAttributeValue(attrURL);
                if (url[0] != '#')
                    ThrowException("Unsupported URL format in instance_image");
                url++;
                pParam.mType = Param_Sampler;
                pParam.mReference = url;
                SkipElement("sampler2D");
            }
            else
            {
                // ignore unknown element
                SkipElement();
            }
        }
        else if (mReader->getNodeType() == irr::io::EXN_ELEMENT_END) {
            break;
        }
    }
}